

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCallFinal
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,bool allowFailure)

{
  TypeHandle *pTVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  SynIdentifier *pSVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  IntrusiveList<TypeHandle> generics_03;
  IntrusiveList<TypeHandle> generics_04;
  InplaceStr functionName;
  InplaceStr functionName_00;
  FunctionValue proto;
  FunctionValue proto_00;
  FunctionValue proto_01;
  FunctionValue proto_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<ArgumentData> arguments_04;
  IntrusiveList<TypeHandle> generics_05;
  IntrusiveList<TypeHandle> generics_06;
  ArrayView<ArgumentData> arguments_05;
  ArrayView<ArgumentData> arguments_06;
  ArrayView<unsigned_int> ratings_00;
  ArrayView<unsigned_int> ratings_01;
  ExprBase *pEVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  ArgumentData *pAVar20;
  FunctionValue *pFVar21;
  uint *puVar22;
  undefined4 extraout_var_00;
  TypeBase *pTVar23;
  TypeFunction *pTVar24;
  TypeFunction *pTVar25;
  FunctionData **ppFVar26;
  ExprBase *pEVar27;
  ModuleData *pMVar28;
  TypeRef *pTVar29;
  undefined4 extraout_var_02;
  FunctionData *pFVar30;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  CallArgumentData *pCVar31;
  size_t sVar32;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  uint i_10;
  char *pcVar33;
  uint i;
  uint uVar34;
  ExpressionContext *pEVar35;
  char *pcVar36;
  undefined7 in_register_00000089;
  IntrusiveList<TypeHandle> *pIVar37;
  uint k;
  char *pcVar38;
  uint i_3;
  uint uVar39;
  ExpressionContext *__haystack;
  IntrusiveList<ExprBase> *this;
  ulong uVar40;
  bool bVar41;
  undefined4 uVar42;
  ArrayView<FunctionValue> functions_02;
  ArrayView<ArgumentData> arguments_07;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> functionArguments_00;
  ArrayView<ArgumentData> functionArguments_01;
  InplaceStr name;
  ArrayView<ArgumentData> functionArguments_02;
  ArrayView<ArgumentData> arguments_08;
  ArrayView<CallArgumentData> arguments_09;
  ArrayView<ArgumentData> arguments_10;
  ArrayView<CallArgumentData> arguments_11;
  ArrayView<ArgumentData> arguments_12;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_13;
  undefined4 uVar43;
  FunctionData *local_8f0;
  TypeFunction *local_8e0;
  ArrayView<FunctionValue> functions_local;
  IntrusiveList<ExprBase> actualArguments;
  SynBase *local_8a8;
  undefined8 uStack_8a0;
  TypeBase *local_898;
  ModuleData *local_890;
  ExpressionContext *local_888;
  ModuleData *local_880;
  FunctionData *pFStack_878;
  ModuleData *local_870;
  ModuleData *local_868;
  FunctionData *pFStack_860;
  ModuleData *local_858;
  ModuleData *local_850;
  FunctionData *pFStack_848;
  ModuleData *local_840;
  ModuleData *local_838;
  uint uStack_830;
  undefined4 uStack_82c;
  ModuleData *local_828;
  uint uStack_820;
  undefined4 uStack_81c;
  IntrusiveList<MatchData> aliasesB;
  IntrusiveList<MatchData> aliasesA;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<CallArgumentData,_16U> resultB;
  IntrusiveList<ExprBase> errorArguments;
  ExprBase local_638 [5];
  SynIdentifier *local_538;
  undefined4 extraout_var_01;
  
  pFVar21 = functions.data;
  pEVar27 = (ExprBase *)(CONCAT71(in_register_00000089,allowFailure) & 0xffffffff);
  functions_local.count = functions.count;
  uVar34 = 0;
  functions_local.data = pFVar21;
  if ((value == (ExprBase *)0x0) || (value->type == (TypeBase *)0x0)) {
    bVar41 = false;
  }
  else {
    bVar41 = value->type->typeID == 0;
  }
  for (; uVar34 < arguments.count; uVar34 = uVar34 + 1) {
    pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
    pTVar23 = pAVar20->value->type;
    if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0)) {
      pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
      bVar15 = AssertResolvableTypeLiteral(ctx,source,pAVar20->value);
      if (!bVar15) goto LAB_001c4c76;
    }
    else {
LAB_001c4c76:
      bVar41 = true;
    }
  }
  pIVar37 = &generics;
  while (pTVar1 = pIVar37->head, pTVar1 != (TypeHandle *)0x0) {
    pTVar23 = pTVar1->type;
    if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0)) {
      pFVar21 = (FunctionValue *)0x0;
      bVar15 = AssertResolvableType(ctx,source,pTVar23,false);
      if (!bVar15) goto LAB_001c4cbd;
    }
    else {
LAB_001c4cbd:
      bVar41 = true;
    }
    pIVar37 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
  }
  if (bVar41) {
    errorArguments.head._0_4_ = 0;
    errorArguments.head._4_4_ = 0;
    errorArguments.tail._0_4_ = 0;
    errorArguments.tail._4_4_ = 0;
    uVar34 = 0;
    while( true ) {
      pAVar2 = ctx->allocator;
      if (arguments.count <= uVar34) break;
      iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
      pSVar3 = pAVar20->value->source;
      pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
      pTVar23 = pAVar20->value->type;
      pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
      ExprPassthrough::ExprPassthrough
                ((ExprPassthrough *)CONCAT44(extraout_var,iVar16),pSVar3,pTVar23,pAVar20->value);
      IntrusiveList<ExprBase>::push_back(&errorArguments,(ExprBase *)CONCAT44(extraout_var,iVar16));
      uVar34 = uVar34 + 1;
    }
    iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x48);
    pEVar27 = (ExprBase *)CONCAT44(extraout_var_00,iVar16);
    pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar27->typeID = 0x29;
    pEVar27->source = source;
    pEVar27->type = pTVar23;
    pEVar27->next = (ExprBase *)0x0;
    pEVar27->listed = false;
    pEVar27->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
    pEVar27[1]._vptr_ExprBase = (_func_int **)value;
    goto LAB_001c6297;
  }
  if (((value == (ExprBase *)0x0) ||
      (local_8e0 = (TypeFunction *)value->type, local_8e0 == (TypeFunction *)0x0)) ||
     ((local_8e0->super_TypeBase).typeID != 0x15)) {
    local_8e0 = (TypeFunction *)0x0;
  }
  actualArguments.head = (ExprBase *)0x0;
  actualArguments.tail = (ExprBase *)0x0;
  if (functions_local.count == 0) {
    if (local_8e0 != (TypeFunction *)0x0) {
      if (local_8e0->returnType == ctx->typeAuto) {
        anon_unknown.dwarf_ff84f::Report
                  (ctx,source,"ERROR: function type is unresolved at this point");
        goto LAB_001c5b39;
      }
      SmallArray<ArgumentData,_8U>::SmallArray
                ((SmallArray<ArgumentData,_8U> *)&errorArguments,ctx->allocator);
      pIVar37 = &local_8e0->arguments;
      while (pTVar1 = pIVar37->head, pTVar1 != (TypeHandle *)0x0) {
        resultB.little[0].value = (ExprBase *)pTVar1->type;
        resultB.data = (CallArgumentData *)0x0;
        resultB.count = resultB.count & 0xffffff00;
        resultB.little[0].type = (TypeBase *)0x0;
        resultB.little[1].type = (TypeBase *)0x0;
        resultB.little[1].value = (ExprBase *)0x0;
        SmallArray<ArgumentData,_8U>::push_back
                  ((SmallArray<ArgumentData,_8U> *)&errorArguments,(ArgumentData *)&resultB);
        pIVar37 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
      }
      pAVar2 = ctx->allocator;
      memset(resultB.little,0,0x100);
      resultB.count = 0;
      resultB.max = 0x10;
      functionArguments_01.data._4_4_ = errorArguments.head._4_4_;
      functionArguments_01.data._0_4_ = (uint)errorArguments.head;
      functionArguments_01.count = (uint)errorArguments.tail;
      arguments_12.count = arguments.count;
      arguments_12.data = arguments.data;
      functionArguments_01._12_4_ = 0;
      arguments_12._12_4_ = 0;
      resultB.data = resultB.little;
      resultB.allocator = pAVar2;
      bVar41 = PrepareArgumentsForFunctionCall
                         (ctx,source,functionArguments_01,arguments_12,&resultB,(uint *)0x0,true);
      if (bVar41) {
        for (uVar34 = 0; uVar34 < resultB.count; uVar34 = uVar34 + 1) {
          pCVar31 = SmallArray<CallArgumentData,_16U>::operator[](&resultB,uVar34);
          IntrusiveList<ExprBase>::push_back(&actualArguments,pCVar31->value);
        }
      }
      else if ((char)pEVar27 == '\0') {
        pcVar38 = ctx->errorBuf;
        if ((pcVar38 != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = pcVar38;
            pcVar36 = pcVar38;
          }
          else {
            pcVar36 = ctx->errorBufLocation;
          }
          iVar16 = (int)pcVar36;
          uVar34 = ctx->errorBufSize + ((int)pcVar38 - iVar16);
          if (arguments.count == (uint)errorArguments.tail) {
            iVar18 = NULLC::SafeSprintf(pcVar36,(ulong)uVar34,
                                        "ERROR: there is no conversion from specified arguments and the ones that function accepts\n"
                                       );
          }
          else {
            iVar18 = NULLC::SafeSprintf(pcVar36,(ulong)uVar34,
                                        "ERROR: function expects %d argument(s), while %d are supplied\n"
                                       );
          }
          iVar19 = NULLC::SafeSprintf(pcVar36 + iVar18,(ulong)(uVar34 - iVar18),"\tExpected: (");
          pcVar38 = pcVar36 + iVar18 + iVar19;
          for (uVar39 = 0; uVar40 = (ulong)((iVar16 - (int)pcVar38) + uVar34),
              uVar39 < (uint)errorArguments.tail; uVar39 = uVar39 + 1) {
            pcVar33 = ", ";
            if (uVar39 == 0) {
              pcVar33 = "";
            }
            pAVar20 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&errorArguments,uVar39);
            iVar18 = *(int *)&(pAVar20->type->name).end;
            pAVar20 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&errorArguments,uVar39);
            iVar19 = *(int *)&(pAVar20->type->name).begin;
            pAVar20 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&errorArguments,uVar39);
            iVar18 = NULLC::SafeSprintf(pcVar38,uVar40,"%s%.*s",pcVar33,
                                        (ulong)(uint)(iVar18 - iVar19),(pAVar20->type->name).begin);
            pcVar38 = pcVar38 + iVar18;
          }
          iVar18 = NULLC::SafeSprintf(pcVar38,uVar40,")\n");
          pcVar38 = pcVar38 + iVar18;
          iVar18 = NULLC::SafeSprintf(pcVar38,(ulong)((iVar16 - (int)pcVar38) + uVar34),
                                      "\tProvided: (");
          pcVar38 = pcVar38 + iVar18;
          uVar39 = 0;
          while( true ) {
            uVar40 = (ulong)((iVar16 - (int)pcVar38) + uVar34);
            if (arguments.count <= uVar39) break;
            pcVar33 = ", ";
            if (uVar39 == 0) {
              pcVar33 = "";
            }
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar39);
            iVar18 = *(int *)&(pAVar20->type->name).end;
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar39);
            iVar19 = *(int *)&(pAVar20->type->name).begin;
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar39);
            iVar18 = NULLC::SafeSprintf(pcVar38,uVar40,"%s%.*s",pcVar33,
                                        (ulong)(uint)(iVar18 - iVar19),(pAVar20->type->name).begin);
            pcVar38 = pcVar38 + iVar18;
            uVar39 = uVar39 + 1;
          }
          NULLC::SafeSprintf(pcVar38,uVar40,")");
          pcVar38 = ctx->errorBufLocation;
          sVar32 = strlen(pcVar38);
          pcVar38 = pcVar38 + sVar32;
          ctx->errorBufLocation = pcVar38;
          anon_unknown.dwarf_ff84f::AddErrorInfoWithLocation(ctx,source,pcVar36,pcVar38);
        }
        if (ctx->errorHandlerNested == true) {
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1e4e,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          goto LAB_001c67f1;
        }
        ctx->errorCount = ctx->errorCount + 1;
        ratings.data = (uint *)0x0;
        ratings.count = 0;
        ratings.max = 0;
        uVar34 = 0;
        while( true ) {
          pAVar2 = ctx->allocator;
          if (arguments.count <= uVar34) break;
          iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
          pSVar3 = pAVar20->value->source;
          pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
          pTVar23 = pAVar20->value->type;
          pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_13,iVar16),pSVar3,pTVar23,
                     pAVar20->value);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)&ratings,
                     (ExprBase *)CONCAT44(extraout_var_13,iVar16));
          uVar34 = uVar34 + 1;
        }
        iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x48);
        pEVar27 = (ExprBase *)CONCAT44(extraout_var_14,iVar16);
        pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar27->typeID = 0x29;
        pEVar27->source = source;
        pEVar27->type = pTVar23;
        pEVar27->next = (ExprBase *)0x0;
        pEVar27->listed = false;
        pEVar27->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
        pEVar27[1]._vptr_ExprBase = (_func_int **)value;
        *(uint **)&pEVar27[1].typeID = ratings.data;
        pEVar27[1].source = (SynBase *)ratings._8_8_;
      }
      else {
        pEVar27 = (ExprBase *)0x0;
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray(&resultB);
      SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)&errorArguments);
      goto joined_r0x001c6656;
    }
    if (value != (ExprBase *)0x0) {
      uVar34 = value->typeID;
      if ((uVar34 == 8) && (pFVar21 = (FunctionValue *)&arguments, arguments.count == 1)) {
        pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,0);
        uVar34 = value->typeID;
        if (pAVar20->name != (SynIdentifier *)0x0) goto LAB_001c578a;
        if (uVar34 != 8) {
LAB_001c5f10:
          pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,0);
          pEVar27 = CreateCast(ctx,source,pAVar20->value,(TypeBase *)value[1]._vptr_ExprBase,true);
          return pEVar27;
        }
        pp_Var6 = value[1]._vptr_ExprBase;
        if ((pp_Var6 != (_func_int **)0x0) && (*(int *)(pp_Var6 + 1) == 0x16)) goto LAB_001c6805;
        if (*(char *)((long)pp_Var6 + 0x3c) != '\x01') goto LAB_001c5f10;
LAB_001c67dd:
        pcVar38 = "ERROR: can\'t cast to a generic type";
LAB_001c680c:
        goto LAB_001c6726;
      }
LAB_001c578a:
      if (uVar34 == 8) {
        pp_Var6 = value[1]._vptr_ExprBase;
        if ((pp_Var6 != (_func_int **)0x0) && (*(int *)(pp_Var6 + 1) == 0x16)) {
LAB_001c6805:
          pcVar38 = "ERROR: generic type arguments in <> are not found after constructor name";
          goto LAB_001c680c;
        }
        if (*(char *)((long)pp_Var6 + 0x3c) == '\x01') goto LAB_001c67dd;
      }
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pFVar21;
    name_00.end = "";
    name_00.begin = "()";
    pEVar27 = CreateVariableAccess
                        (ctx,source,(IntrusiveList<SynIdentifier>)(auVar13 << 0x40),name_00,false);
    if (pEVar27 != (ExprBase *)0x0) {
      SmallArray<ArgumentData,_32U>::SmallArray
                ((SmallArray<ArgumentData,_32U> *)&errorArguments,ctx->allocator);
      resultB.data = (CallArgumentData *)value->source;
      resultB.little[0].value = (ExprBase *)value->type;
      resultB.count = resultB.count & 0xffffff00;
      resultB.little[0].type = (TypeBase *)0x0;
      resultB.little[1].value = (ExprBase *)0x0;
      resultB.little[1].type = (TypeBase *)value;
      SmallArray<ArgumentData,_32U>::push_back
                ((SmallArray<ArgumentData,_32U> *)&errorArguments,(ArgumentData *)&resultB);
      for (uVar34 = 0; uVar34 < arguments.count; uVar34 = uVar34 + 1) {
        pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
        SmallArray<ArgumentData,_32U>::push_back
                  ((SmallArray<ArgumentData,_32U> *)&errorArguments,pAVar20);
      }
      arguments_07.data._4_4_ = errorArguments.head._4_4_;
      arguments_07.data._0_4_ = (uint)errorArguments.head;
      arguments_07.count = (uint)errorArguments.tail;
      arguments_07._12_4_ = 0;
      pEVar27 = CreateFunctionCall(ctx,source,pEVar27,arguments_07,false);
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&errorArguments);
      if (pEVar27 != (ExprBase *)0x0) {
        return pEVar27;
      }
      goto LAB_001c66f8;
    }
    anon_unknown.dwarf_ff84f::Report
              (ctx,source,
               "ERROR: operator \'()\' accepting %d argument(s) is undefined for a class \'%.*s\'",
               (ulong)arguments.count,
               (ulong)(uint)(*(int *)&(value->type->name).end - (int)(value->type->name).begin));
LAB_001c5b39:
    iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar27 = (ExprBase *)CONCAT44(extraout_var_05,iVar16);
    pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
  else {
    ratings.allocator = ctx->allocator;
    ratings.data = ratings.little;
    ratings.count = 0;
    ratings.max = 0x20;
    arguments_00._12_4_ = arguments._12_4_;
    arguments_00.count = arguments.count;
    pEVar35 = (ExpressionContext *)&local_8a8;
    generics_04.tail._0_4_ = (int)generics.tail;
    generics_04.head = generics.head;
    generics_04.tail._4_4_ = (int)((ulong)generics.tail >> 0x20);
    arguments_00.data = arguments.data;
    functions_02.count = functions_local.count;
    functions_02.data = functions_local.data;
    functions_02._12_4_ = 0;
    SelectBestFunction((FunctionValue *)pEVar35,ctx,source,functions_02,generics_04,arguments_00,
                       &ratings);
    pFVar30 = uStack_8a0;
    local_8f0 = uStack_8a0;
    if (uStack_8a0 == (FunctionData *)0x0) {
      if ((char)pEVar27 == '\0') {
        if ((((value == (ExprBase *)0x0) || (value->typeID != 8)) || (arguments.count != 1)) ||
           ((pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,0),
            (TypeStruct *)pAVar20->type != ctx->typeAutoRef ||
            (pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,0),
            pAVar20->name != (SynIdentifier *)0x0)))) {
          pcVar38 = ctx->errorBuf;
          if ((pcVar38 != (char *)0x0) && (uVar34 = ctx->errorBufSize, uVar34 != 0)) {
            if (ctx->errorCount == 0) {
              ctx->errorPos = (source->pos).begin;
              ctx->errorBufLocation = pcVar38;
              pcVar36 = pcVar38;
            }
            else {
              pcVar36 = ctx->errorBufLocation;
            }
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
            iVar16 = *(int *)&(pFVar21->function->name->name).end;
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
            iVar18 = *(int *)&(pFVar21->function->name->name).begin;
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
            NULLC::SafeSprintf(pcVar36,(ulong)(uVar34 + ((int)pcVar38 - (int)pcVar36)),
                               "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                               (ulong)(uint)(iVar16 - iVar18),(pFVar21->function->name->name).begin)
            ;
            pcVar38 = ctx->errorBufLocation;
            sVar32 = strlen(pcVar38);
            pcVar38 = pcVar38 + sVar32;
            ctx->errorBufLocation = pcVar38;
            iVar16 = *(int *)&ctx->errorBuf;
            uVar34 = ctx->errorBufSize;
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
            pSVar5 = pFVar21->function->name;
            local_828 = (ModuleData *)ratings.data;
            uStack_820 = ratings.count;
            ratings_01._12_4_ = uStack_81c;
            ratings_01.count = ratings.count;
            arguments_06._12_4_ = arguments._12_4_;
            arguments_06.count = arguments.count;
            functions_01._12_4_ = functions_local._12_4_;
            functions_01.count = functions_local.count;
            functionName_00.end._4_4_ = (int)((ulong)(pSVar5->name).end >> 0x20);
            functionName_00._0_12_ = *(undefined1 (*) [12])&pSVar5->name;
            functions_01.data = functions_local.data;
            generics_06.tail = generics.tail;
            generics_06.head = generics.head;
            arguments_06.data = arguments.data;
            ratings_01.data = ratings.data;
            ReportOnFunctionSelectError
                      (ctx,source,pcVar38,(iVar16 - (int)pcVar38) + uVar34,pcVar36,functionName_00,
                       functions_01,generics_06,arguments_06,ratings_01,0xffffffff,true);
            pcVar38 = ctx->errorBufLocation;
            sVar32 = strlen(pcVar38);
            ctx->errorBufLocation = pcVar38 + sVar32;
          }
          if (ctx->errorHandlerNested == true) {
            if (ctx->errorHandlerActive == false) {
              __assert_fail("ctx.errorHandlerActive",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1d49,
                            "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                           );
            }
LAB_001c67f1:
            longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
          }
          ctx->errorCount = ctx->errorCount + 1;
          errorArguments.head._0_4_ = 0;
          errorArguments.head._4_4_ = 0;
          errorArguments.tail._0_4_ = 0;
          errorArguments.tail._4_4_ = 0;
          uVar34 = 0;
          while( true ) {
            pAVar2 = ctx->allocator;
            if (arguments.count <= uVar34) break;
            iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
            pSVar3 = pAVar20->value->source;
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
            pTVar23 = pAVar20->value->type;
            pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
            ExprPassthrough::ExprPassthrough
                      ((ExprPassthrough *)CONCAT44(extraout_var_10,iVar16),pSVar3,pTVar23,
                       pAVar20->value);
            IntrusiveList<ExprBase>::push_back
                      (&errorArguments,(ExprBase *)CONCAT44(extraout_var_10,iVar16));
            uVar34 = uVar34 + 1;
          }
          iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x48);
          pEVar27 = (ExprBase *)CONCAT44(extraout_var_11,iVar16);
          pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
LAB_001c617c:
          pEVar14 = (ExprBase *)CONCAT44(errorArguments.head._4_4_,(uint)errorArguments.head);
          pEVar27->typeID = 0x29;
          pEVar27->source = source;
          pEVar27->type = pTVar23;
          pEVar27->next = (ExprBase *)0x0;
          pEVar27->listed = false;
          pEVar27->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
          pEVar27[1]._vptr_ExprBase = (_func_int **)value;
          uVar34 = (uint)errorArguments.tail;
          uVar42 = errorArguments.tail._4_4_;
          goto LAB_001c61ac;
        }
        pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,0);
        pEVar27 = CreateCast(ctx,source,pAVar20->value,(TypeBase *)value[1]._vptr_ExprBase,true);
        pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
        if ((pFVar21->context == (ExprBase *)0x0) || (pFVar21->context->typeID != 9)) {
          bVar41 = false;
          pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
          pEVar27 = CreateAssignment(ctx,source,pFVar21->context,pEVar27);
          goto LAB_001c61b3;
        }
        goto LAB_001c61b1;
      }
      bVar41 = false;
      pEVar27 = (ExprBase *)0x0;
    }
    else {
      uVar34 = 0xffffffff;
      for (uVar39 = 0; pTVar23 = local_898, uVar39 < functions_local.count; uVar39 = uVar39 + 1) {
        pEVar35 = (ExpressionContext *)&functions_local;
        pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
        if (pFVar21->function == pFVar30) {
          pEVar35 = (ExpressionContext *)&ratings;
          puVar22 = SmallArray<unsigned_int,_32U>::operator[](&ratings,uVar39);
          uVar34 = *puVar22;
        }
      }
      for (uVar39 = 0; uVar39 < functions_local.count; uVar39 = uVar39 + 1) {
        pEVar35 = (ExpressionContext *)&functions_local;
        pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
        if (pFVar21->function != pFVar30) {
          pEVar35 = (ExpressionContext *)&ratings;
          puVar22 = SmallArray<unsigned_int,_32U>::operator[](&ratings,uVar39);
          if (*puVar22 != uVar34) goto LAB_001c5188;
          pTVar4 = (TypeBase *)(pTVar23->name).end;
          if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0x10)) {
            pEVar35 = (ExpressionContext *)&functions_local;
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
            bVar41 = ExpressionContext::IsGenericFunction(pEVar35,pFVar21->function);
            if (bVar41) {
              bVar41 = ExpressionContext::IsGenericFunction(pEVar35,pFVar30);
              if (bVar41) {
                aliasesA.head = (MatchData *)0x0;
                aliasesA.tail = (MatchData *)0x0;
                pSVar5 = (SynIdentifier *)ctx->allocator;
                memset(local_638,0,0x100);
                errorArguments.tail._0_4_ = 0;
                errorArguments.tail._4_4_ = 0x10;
                local_538 = pSVar5;
                errorArguments.head = local_638;
                pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
                uVar7 = (pFVar21->function->arguments).data;
                uVar8 = (pFVar21->function->arguments).count;
                functionArguments.count = uVar8;
                functionArguments.data = (ArgumentData *)uVar7;
                arguments_08.count = arguments.count;
                arguments_08.data = arguments.data;
                functionArguments._12_4_ = 0;
                arguments_08._12_4_ = 0;
                bVar41 = PrepareArgumentsForFunctionCall
                                   (ctx,source,functionArguments,arguments_08,
                                    (SmallArray<CallArgumentData,_16U> *)&errorArguments,(uint *)0x0
                                    ,false);
                if (bVar41) {
                  pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
                  pTVar4 = pFVar21->function->scope->ownerType;
                  pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,uVar39);
                  arguments_09.count = (uint)errorArguments.tail;
                  arguments_09.data = (CallArgumentData *)errorArguments.head;
                  arguments_09._12_4_ = 0;
                  pTVar24 = GetGenericFunctionInstanceType
                                      (ctx,source,pTVar4,pFVar21->function,arguments_09,&aliasesA);
                }
                else {
                  pTVar24 = (TypeFunction *)0x0;
                }
                aliasesB.head = (MatchData *)0x0;
                aliasesB.tail = (MatchData *)0x0;
                pAVar2 = ctx->allocator;
                memset(resultB.little,0,0x100);
                resultB.count = 0;
                resultB.max = 0x10;
                uVar9 = (pFVar30->arguments).data;
                uVar10 = (pFVar30->arguments).count;
                functionArguments_00.count = uVar10;
                functionArguments_00.data = (ArgumentData *)uVar9;
                arguments_10.count = arguments.count;
                arguments_10.data = arguments.data;
                functionArguments_00._12_4_ = 0;
                arguments_10._12_4_ = 0;
                resultB.data = resultB.little;
                resultB.allocator = pAVar2;
                bVar41 = PrepareArgumentsForFunctionCall
                                   (ctx,source,functionArguments_00,arguments_10,&resultB,
                                    (uint *)0x0,false);
                if (bVar41) {
                  arguments_11.count = resultB.count;
                  arguments_11.data = resultB.data;
                  arguments_11._12_4_ = 0;
                  pTVar25 = GetGenericFunctionInstanceType
                                      (ctx,source,pFVar30->scope->ownerType,pFVar30,arguments_11,
                                       &aliasesB);
                }
                else {
                  pTVar25 = (TypeFunction *)0x0;
                }
                SmallArray<CallArgumentData,_16U>::~SmallArray(&resultB);
                pEVar35 = (ExpressionContext *)&errorArguments;
                SmallArray<CallArgumentData,_16U>::~SmallArray
                          ((SmallArray<CallArgumentData,_16U> *)pEVar35);
                if (((pTVar24 == pTVar25) && (pTVar24 != (TypeFunction *)0x0)) &&
                   (pTVar25 != (TypeFunction *)0x0)) goto LAB_001c5188;
              }
            }
          }
          pcVar38 = ctx->errorBuf;
          if ((pcVar38 != (char *)0x0) && (ctx->errorBufSize != 0)) {
            if (ctx->errorCount == 0) {
              ctx->errorPos = (source->pos).begin;
              ctx->errorBufLocation = pcVar38;
              pcVar36 = pcVar38;
            }
            else {
              pcVar36 = ctx->errorBufLocation;
            }
            NULLC::SafeSprintf(pcVar36,(ulong)(ctx->errorBufSize + ((int)pcVar38 - (int)pcVar36)),
                               "ERROR: ambiguity, there is more than one overloaded function available for the call:\n"
                              );
            pcVar38 = ctx->errorBufLocation;
            sVar32 = strlen(pcVar38);
            pcVar38 = pcVar38 + sVar32;
            ctx->errorBufLocation = pcVar38;
            iVar16 = *(int *)&ctx->errorBuf;
            uVar39 = ctx->errorBufSize;
            pFVar21 = ArrayView<FunctionValue>::operator[](&functions_local,0);
            pSVar5 = pFVar21->function->name;
            local_838 = (ModuleData *)ratings.data;
            uStack_830 = ratings.count;
            ratings_00._12_4_ = uStack_82c;
            ratings_00.count = ratings.count;
            arguments_05._12_4_ = arguments._12_4_;
            arguments_05.count = arguments.count;
            functions_00._12_4_ = functions_local._12_4_;
            functions_00.count = functions_local.count;
            functionName.end._4_4_ = (int)((ulong)(pSVar5->name).end >> 0x20);
            functionName._0_12_ = *(undefined1 (*) [12])&pSVar5->name;
            functions_00.data = functions_local.data;
            generics_05.tail = generics.tail;
            generics_05.head = generics.head;
            arguments_05.data = arguments.data;
            ratings_00.data = ratings.data;
            ReportOnFunctionSelectError
                      (ctx,source,pcVar38,(iVar16 - (int)pcVar38) + uVar39,pcVar36,functionName,
                       functions_00,generics_05,arguments_05,ratings_00,uVar34,true);
            pcVar38 = ctx->errorBufLocation;
            sVar32 = strlen(pcVar38);
            ctx->errorBufLocation = pcVar38 + sVar32;
          }
          if (ctx->errorHandlerNested != true) {
            ctx->errorCount = ctx->errorCount + 1;
            errorArguments.head._0_4_ = 0;
            errorArguments.head._4_4_ = 0;
            errorArguments.tail._0_4_ = 0;
            errorArguments.tail._4_4_ = 0;
            uVar34 = 0;
            while( true ) {
              pAVar2 = ctx->allocator;
              if (arguments.count <= uVar34) break;
              iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
              pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
              pSVar3 = pAVar20->value->source;
              pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
              pTVar23 = pAVar20->value->type;
              pAVar20 = ArrayView<ArgumentData>::operator[](&arguments,uVar34);
              ExprPassthrough::ExprPassthrough
                        ((ExprPassthrough *)CONCAT44(extraout_var_07,iVar16),pSVar3,pTVar23,
                         pAVar20->value);
              IntrusiveList<ExprBase>::push_back
                        (&errorArguments,(ExprBase *)CONCAT44(extraout_var_07,iVar16));
              uVar34 = uVar34 + 1;
            }
            iVar16 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x48);
            pEVar27 = (ExprBase *)CONCAT44(extraout_var_08,iVar16);
            pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            goto LAB_001c617c;
          }
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1d90,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          goto LAB_001c67f1;
        }
LAB_001c5188:
      }
      local_8e0 = pFVar30->type;
      if ((local_8e0 == (TypeFunction *)0x0) || ((local_8e0->super_TypeBase).typeID != 0x15)) {
        local_8e0 = (TypeFunction *)0x0;
      }
      pTVar23 = (TypeBase *)(pTVar23->name).end;
      if ((pTVar23 != (TypeBase *)0x0) && (pTVar23->typeID == 0x10)) {
        __haystack = (ExpressionContext *)(pFVar30->name->name).begin;
        local_890 = (ModuleData *)(pFVar30->name->name).end;
        if (pFVar30->scope->ownerType != (TypeBase *)0x0) {
          pEVar35 = __haystack;
          pcVar38 = strstr((char *)__haystack,"::");
          if (pcVar38 != (char *)0x0) {
            __haystack = (ExpressionContext *)(pcVar38 + 2);
            pEVar35 = __haystack;
            sVar32 = strlen((char *)__haystack);
            local_890 = (ModuleData *)(pcVar38 + sVar32 + 2);
          }
        }
        local_888 = __haystack;
        for (uVar34 = 0; uVar34 < (ctx->functions).count; uVar34 = uVar34 + 1) {
          pEVar35 = (ExpressionContext *)&ctx->functions;
          ppFVar26 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,uVar34);
          pFVar30 = *ppFVar26;
          pTVar23 = pFVar30->scope->ownerType;
          if ((pTVar23 != (TypeBase *)0x0) &&
             ((pTVar23->isGeneric != false || ((pFVar30->type->super_TypeBase).isGeneric == true))))
          {
            uVar39 = NULLC::StringHashContinue(pTVar23->nameHash,"::");
            pEVar35 = (ExpressionContext *)(ulong)uVar39;
            uVar39 = NULLC::StringHashContinue(uVar39,(char *)local_888,(char *)local_890);
            if (pFVar30->nameHash == uVar39) {
              uVar39 = IntrusiveList<MatchData>::size(&pFVar30->generics);
              pEVar35 = (ExpressionContext *)&generics;
              uVar17 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)pEVar35);
              if (uVar39 == uVar17) {
                uVar39 = IntrusiveList<TypeHandle>::size(&pFVar30->type->arguments);
                pEVar35 = (ExpressionContext *)&local_8f0->type->arguments;
                uVar17 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)pEVar35);
                if (uVar39 == uVar17) {
                  pTVar23 = pFVar30->scope->ownerType;
                  uVar42 = SUB84(pFVar30,0);
                  uVar43 = (undefined4)((ulong)pFVar30 >> 0x20);
                  if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0x16)) {
                    iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                    pMVar28 = (ModuleData *)CONCAT44(extraout_var_02,iVar16);
                    pTVar29 = ExpressionContext::GetReferenceType(ctx,pFVar30->scope->ownerType);
                    *(undefined4 *)&(pMVar28->name).begin = 9;
                    (pMVar28->name).end = (char *)source;
                    *(TypeRef **)&pMVar28->importIndex = pTVar29;
                    pMVar28->bytecode = (ByteCode *)0x0;
                    *(undefined1 *)&pMVar28->lexer = 0;
                    pMVar28->source = (SynBase *)&PTR__ExprBase_003e35c8;
                    generics_02.tail = generics.tail;
                    generics_02.head = generics.head;
                    arguments_03._12_4_ = arguments._12_4_;
                    arguments_03.count = arguments.count;
                    pEVar35 = (ExpressionContext *)&errorArguments;
                    proto_01.function._0_4_ = uVar42;
                    proto_01.source = source;
                    proto_01.function._4_4_ = uVar43;
                    proto_01.context._0_4_ = iVar16;
                    proto_01.context._4_4_ = extraout_var_02;
                    arguments_03.data = arguments.data;
                    local_880 = (ModuleData *)source;
                    pFStack_878 = pFVar30;
                    local_870 = pMVar28;
                    CreateGenericFunctionInstance
                              ((FunctionValue *)pEVar35,ctx,source,proto_01,generics_02,arguments_03
                               ,true);
                  }
                  else {
                    puVar22 = &pTVar23[2].typeID;
                    uVar39 = 0;
                    while( true ) {
                      pEVar35 = (ExpressionContext *)puVar22;
                      uVar17 = IntrusiveList<ExprBase>::size((IntrusiveList<ExprBase> *)puVar22);
                      if (uVar17 <= uVar39) break;
                      pEVar27 = IntrusiveList<ExprBase>::operator[]
                                          ((IntrusiveList<ExprBase> *)puVar22,uVar39);
                      if ((pEVar27 == (ExprBase *)0x0) || (pEVar27->typeID != 0x2d)) {
                        pEVar27 = (ExprBase *)0x0;
                      }
                      iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                      pMVar28 = (ModuleData *)CONCAT44(extraout_var_01,iVar16);
                      pTVar29 = ExpressionContext::GetReferenceType
                                          (ctx,(TypeBase *)pEVar27[1]._vptr_ExprBase);
                      *(undefined4 *)&(pMVar28->name).begin = 9;
                      (pMVar28->name).end = (char *)source;
                      *(TypeRef **)&pMVar28->importIndex = pTVar29;
                      pMVar28->bytecode = (ByteCode *)0x0;
                      *(undefined1 *)&pMVar28->lexer = 0;
                      pMVar28->source = (SynBase *)&PTR__ExprBase_003e35c8;
                      if (local_8f0->scope->ownerType->isGeneric == true) {
                        generics_00.tail = generics.tail;
                        generics_00.head = generics.head;
                        arguments_01._12_4_ = arguments._12_4_;
                        arguments_01.count = arguments.count;
                        proto.function._0_4_ = uVar42;
                        proto.source = source;
                        proto.function._4_4_ = uVar43;
                        proto.context._0_4_ = iVar16;
                        proto.context._4_4_ = extraout_var_01;
                        arguments_01.data = arguments.data;
                        local_850 = (ModuleData *)source;
                        pFStack_848 = pFVar30;
                        local_840 = pMVar28;
                        CreateGenericFunctionInstance
                                  ((FunctionValue *)&errorArguments,ctx,source,proto,generics_00,
                                   arguments_01,false);
                        local_8f0 = (FunctionData *)
                                    CONCAT44(errorArguments.tail._4_4_,(uint)errorArguments.tail);
                        local_8e0 = local_8f0->type;
                        if ((local_8e0 == (TypeFunction *)0x0) ||
                           ((local_8e0->super_TypeBase).typeID != 0x15)) {
                          local_8e0 = (TypeFunction *)0x0;
                        }
                      }
                      else {
                        generics_01.tail = generics.tail;
                        generics_01.head = generics.head;
                        arguments_02._12_4_ = arguments._12_4_;
                        arguments_02.count = arguments.count;
                        proto_00.function._0_4_ = uVar42;
                        proto_00.source = source;
                        proto_00.function._4_4_ = uVar43;
                        proto_00.context._0_4_ = iVar16;
                        proto_00.context._4_4_ = extraout_var_01;
                        arguments_02.data = arguments.data;
                        local_868 = (ModuleData *)source;
                        pFStack_860 = pFVar30;
                        local_858 = pMVar28;
                        CreateGenericFunctionInstance
                                  ((FunctionValue *)&errorArguments,ctx,source,proto_00,generics_01,
                                   arguments_02,true);
                      }
                      uVar39 = uVar39 + 1;
                    }
                  }
                }
              }
            }
          }
        }
        uStack_8a0 = local_8f0;
      }
      bVar41 = ExpressionContext::IsGenericFunction(pEVar35,local_8f0);
      local_8a8 = (SynBase *)CONCAT44(local_8a8._4_4_,(int)local_8a8);
      if (bVar41) {
        generics_03.tail = generics.tail;
        generics_03.head = generics.head;
        arguments_04._12_4_ = arguments._12_4_;
        arguments_04.count = arguments.count;
        proto_02.source._4_4_ = local_8a8._4_4_;
        proto_02.source._0_4_ = (int)local_8a8;
        proto_02.function._0_4_ = (int)uStack_8a0;
        proto_02.function._4_4_ = (int)((ulong)uStack_8a0 >> 0x20);
        proto_02.context._0_4_ = (int)local_898;
        proto_02.context._4_4_ = (int)((ulong)local_898 >> 0x20);
        arguments_04.data = arguments.data;
        CreateGenericFunctionInstance
                  ((FunctionValue *)&errorArguments,ctx,source,proto_02,generics_03,arguments_04,
                   false);
        local_898 = (TypeBase *)local_638[0]._vptr_ExprBase;
        uStack_8a0 = (FunctionData *)CONCAT44(errorArguments.tail._4_4_,(uint)errorArguments.tail);
        local_8a8 = (SynBase *)errorArguments.head;
        if (uStack_8a0 != (FunctionData *)0x0) {
          local_8f0 = uStack_8a0;
          local_8e0 = uStack_8a0->type;
          goto LAB_001c59fc;
        }
        iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar27 = (ExprBase *)CONCAT44(extraout_var_09,iVar16);
        pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar14 = errorArguments.head;
      }
      else {
LAB_001c59fc:
        pTVar23 = local_898;
        if (local_8e0->returnType != ctx->typeAuto) {
          bVar41 = IsVirtualFunctionCall(ctx,local_8f0,(TypeBase *)(local_898->name).end);
          if (bVar41) {
            pEVar27 = GetFunctionTable(ctx,source,local_8f0);
            name.end = "";
            name.begin = "__redirect";
            pFVar30 = (FunctionData *)
                      CreateFunctionCall2(ctx,source,name,(ExprBase *)pTVar23,pEVar27,false,true,
                                          true);
            iVar16 = (*ctx->allocator->_vptr_Allocator[2])();
            value = (ExprBase *)CONCAT44(extraout_var_03,iVar16);
            pTVar24 = local_8f0->type;
            (((ExprFunctionAccess *)value)->super_ExprBase).typeID = 0x12;
            (((ExprFunctionAccess *)value)->super_ExprBase).source = source;
            (((ExprFunctionAccess *)value)->super_ExprBase).type = &pTVar24->super_TypeBase;
            (((ExprFunctionAccess *)value)->super_ExprBase).next = (ExprBase *)0x0;
            (((ExprFunctionAccess *)value)->super_ExprBase).listed = false;
            (((ExprFunctionAccess *)value)->super_ExprBase)._vptr_ExprBase =
                 (_func_int **)&PTR__ExprBase_003e3478;
            ((ExprFunctionAccess *)value)->function = pFVar30;
            *(undefined4 *)&((ExprFunctionAccess *)value)->context = 0xd;
          }
          else {
            iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            value = (ExprBase *)CONCAT44(extraout_var_06,iVar16);
            ExprFunctionAccess::ExprFunctionAccess
                      ((ExprFunctionAccess *)value,local_8a8,&local_8f0->type->super_TypeBase,
                       local_8f0,(ExprBase *)pTVar23);
          }
          pSVar5 = (SynIdentifier *)ctx->allocator;
          memset(local_638,0,0x100);
          errorArguments.tail._0_4_ = 0;
          errorArguments.tail._4_4_ = 0x10;
          uVar11 = (local_8f0->arguments).data;
          uVar12 = (local_8f0->arguments).count;
          functionArguments_02.count = uVar12;
          functionArguments_02.data = (ArgumentData *)uVar11;
          arguments_13.count = arguments.count;
          arguments_13.data = arguments.data;
          functionArguments_02._12_4_ = 0;
          arguments_13._12_4_ = 0;
          local_538 = pSVar5;
          errorArguments.head = local_638;
          PrepareArgumentsForFunctionCall
                    (ctx,source,functionArguments_02,arguments_13,
                     (SmallArray<CallArgumentData,_16U> *)&errorArguments,(uint *)0x0,true);
          pEVar27 = (ExprBase *)0x0;
          while (uVar34 = (uint)pEVar27, uVar34 < (uint)errorArguments.tail) {
            pCVar31 = SmallArray<CallArgumentData,_16U>::operator[]
                                ((SmallArray<CallArgumentData,_16U> *)&errorArguments,uVar34);
            IntrusiveList<ExprBase>::push_back(&actualArguments,pCVar31->value);
            pEVar27 = (ExprBase *)(ulong)(uVar34 + 1);
          }
          SmallArray<CallArgumentData,_16U>::~SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)&errorArguments);
          bVar41 = true;
          goto LAB_001c61b3;
        }
        anon_unknown.dwarf_ff84f::Report
                  (ctx,source,"ERROR: function type is unresolved at this point");
        iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar27 = (ExprBase *)CONCAT44(extraout_var_04,iVar16);
        pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar14 = errorArguments.head;
      }
      pEVar27->typeID = 0x29;
      pEVar27->source = source;
      pEVar27->type = pTVar23;
      pEVar27->next = (ExprBase *)0x0;
      pEVar27->listed = false;
      pEVar27->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
      pEVar27[1]._vptr_ExprBase = (_func_int **)value;
      errorArguments.head._0_4_ = (uint)actualArguments.head;
      errorArguments.head._4_4_ = actualArguments.head._4_4_;
      uVar34 = (uint)actualArguments.tail;
      uVar42 = actualArguments.tail._4_4_;
LAB_001c61ac:
      pEVar27[1].typeID = (uint)errorArguments.head;
      *(undefined4 *)&pEVar27[1].field_0xc = errorArguments.head._4_4_;
      *(uint *)&pEVar27[1].source = uVar34;
      *(undefined4 *)((long)&pEVar27[1].source + 4) = uVar42;
      errorArguments.head = pEVar14;
LAB_001c61b1:
      bVar41 = false;
    }
LAB_001c61b3:
    SmallArray<unsigned_int,_32U>::~SmallArray(&ratings);
joined_r0x001c6656:
    if (!bVar41) {
      return pEVar27;
    }
    if (local_8e0 == (TypeFunction *)0x0) {
LAB_001c66f8:
      __assert_fail("type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e8b,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    if ((local_8e0->super_TypeBase).isGeneric == true) {
      pcVar38 = "ERROR: generic function call is not supported";
LAB_001c6726:
      anon_unknown.dwarf_ff84f::Stop(ctx,source,pcVar38);
    }
    this = &actualArguments;
    uVar34 = IntrusiveList<ExprBase>::size(this);
    pIVar37 = &local_8e0->arguments;
    uVar39 = IntrusiveList<TypeHandle>::size(pIVar37);
    if (uVar34 != uVar39) {
      __assert_fail("actualArguments.size() == type->arguments.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e90,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    while( true ) {
      pTVar1 = pIVar37->head;
      pEVar27 = this->head;
      if ((pEVar27 == (ExprBase *)0x0) || (pTVar1 == (TypeHandle *)0x0)) break;
      if (pEVar27->type != pTVar1->type) {
        __assert_fail("actual->type == expected->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e97,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      this = (IntrusiveList<ExprBase> *)&pEVar27->next;
      pIVar37 = (IntrusiveList<TypeHandle> *)&pTVar1->next;
    }
    if (pEVar27 != (ExprBase *)0x0) {
      __assert_fail("actual == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e99,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    if (pTVar1 != (TypeHandle *)0x0) {
      __assert_fail("expected == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e9a,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    iVar16 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar27 = (ExprBase *)CONCAT44(extraout_var_12,iVar16);
    pTVar23 = local_8e0->returnType;
  }
  pEVar27->typeID = 0x29;
  pEVar27->source = source;
  pEVar27->type = pTVar23;
  pEVar27->next = (ExprBase *)0x0;
  pEVar27->listed = false;
  pEVar27->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3a98;
  pEVar27[1]._vptr_ExprBase = (_func_int **)value;
  errorArguments.head._0_4_ = (uint)actualArguments.head;
  errorArguments.head._4_4_ = actualArguments.head._4_4_;
  errorArguments.tail._0_4_ = (uint)actualArguments.tail;
  errorArguments.tail._4_4_ = actualArguments.tail._4_4_;
LAB_001c6297:
  pEVar27[1].typeID = (uint)errorArguments.head;
  *(undefined4 *)&pEVar27[1].field_0xc = errorArguments.head._4_4_;
  *(uint *)&pEVar27[1].source = (uint)errorArguments.tail;
  *(undefined4 *)((long)&pEVar27[1].source + 4) = errorArguments.tail._4_4_;
  return pEVar27;
}

Assistant:

ExprBase* CreateFunctionCallFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool allowFailure)
{
	bool isErrorCall = false;

	if(value)
	{
		if(isType<TypeError>(value->type))
			isErrorCall = true;
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type) || !AssertResolvableTypeLiteral(ctx, source, arguments[i].value))
			isErrorCall = true;
	}

	for(TypeHandle *curr = generics.head; curr; curr = curr->next)
	{
		if(isType<TypeError>(curr->type) || !AssertResolvableType(ctx, source, curr->type, false))
			isErrorCall = true;
	}

	if(isErrorCall)
	{
		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
	}

	TypeFunction *type = value ? getType<TypeFunction>(value->type) : NULL;

	IntrusiveList<ExprBase> actualArguments;

	if(!functions.empty())
	{
		SmallArray<unsigned, 32> ratings(ctx.allocator);

		FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, generics, arguments, ratings);

		// Didn't find an appropriate function
		if(!bestOverload)
		{
			if(allowFailure)
				return NULL;

			// auto ref -> type cast
			if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && arguments[0].type == ctx.typeAutoRef && !arguments[0].name)
			{
				ExprBase *result = CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);

				// If this was a member function call, store to context
				if(!isType<ExprNullptrLiteral>(functions[0].context))
					return CreateAssignment(ctx, source, functions[0].context, result);

				return result;
			}

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(functions[0].function->name->name));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, ~0u, true);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		unsigned bestRating = ~0u;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function == bestOverload.function)
				bestRating = ratings[i];
		}

		// Check if multiple functions share the same rating
		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function != bestOverload.function && ratings[i] == bestRating)
			{
				// For a function call through 'auto ref' it is ok to have the same function signature in different types
				if(isType<TypeAutoRef>(bestOverload.context->type) && ctx.IsGenericFunction(functions[i].function) && ctx.IsGenericFunction(bestOverload.function))
				{
					TypeFunction *instanceA = NULL;
					IntrusiveList<MatchData> aliasesA;
					SmallArray<CallArgumentData, 16> resultA(ctx.allocator);

					// Handle named argument order, default argument values and variadic functions
					if(PrepareArgumentsForFunctionCall(ctx, source, functions[i].function->arguments, arguments, resultA, NULL, false))
						instanceA = GetGenericFunctionInstanceType(ctx, source, functions[i].function->scope->ownerType, functions[i].function, resultA, aliasesA);

					TypeFunction *instanceB = NULL;
					IntrusiveList<MatchData> aliasesB;
					SmallArray<CallArgumentData, 16> resultB(ctx.allocator);

					if(PrepareArgumentsForFunctionCall(ctx, source, bestOverload.function->arguments, arguments, resultB, NULL, false))
						instanceB = GetGenericFunctionInstanceType(ctx, source, bestOverload.function->scope->ownerType, bestOverload.function, resultB, aliasesB);

					if(instanceA && instanceB && instanceA == instanceB)
						continue;
				}

				if(ctx.errorBuf && ctx.errorBufSize)
				{
					if(ctx.errorCount == 0)
					{
						ctx.errorPos = source->pos.begin;
						ctx.errorBufLocation = ctx.errorBuf;
					}

					const char *messageStart = ctx.errorBufLocation;

					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available for the call:\n");

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, bestRating, true);

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}

				if(ctx.errorHandlerNested)
				{
					assert(ctx.errorHandlerActive);

					longjmp(ctx.errorHandler, 1);
				}

				ctx.errorCount++;

				IntrusiveList<ExprBase> errorArguments;

				for(unsigned i = 0; i < arguments.size(); i++)
					errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
			}
		}

		FunctionData *function = bestOverload.function;

		type = getType<TypeFunction>(function->type);

		if(isType<TypeAutoRef>(bestOverload.context->type))
		{
			InplaceStr baseName = bestOverload.function->name->name;

			if(bestOverload.function->scope->ownerType)
			{
				if(const char *pos = strstr(baseName.begin, "::"))
					baseName = InplaceStr(pos + 2);
			}

			// For function call through 'auto ref', we have to instantiate all matching member functions of generic types
			for(unsigned i = 0; i < ctx.functions.size(); i++)
			{
				FunctionData *el = ctx.functions[i];

				if(!el->scope->ownerType)
					continue;

				if(!el->scope->ownerType->isGeneric && !el->type->isGeneric)
					continue;

				unsigned hash = NULLC::StringHashContinue(el->scope->ownerType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, baseName.begin, baseName.end);

				if(el->nameHash != hash)
					continue;

				if(el->generics.size() != generics.size())
					continue;

				if(el->type->arguments.size() != bestOverload.function->type->arguments.size())
					continue;

				if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(el->scope->ownerType))
				{
					for(unsigned k = 0; k < proto->instances.size(); k++)
					{
						ExprClassDefinition *definition = getType<ExprClassDefinition>(proto->instances[k]);

						ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(definition->classType));

						if(bestOverload.function->scope->ownerType->isGeneric)
						{
							FunctionValue instance = CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, false);

							bestOverload.function = instance.function;

							function = instance.function;

							type = getType<TypeFunction>(function->type);
						}
						else
						{
							CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
						}
					}
				}
				else
				{
					ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(el->scope->ownerType));

					CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
				}
			}
		}

		if(ctx.IsGenericFunction(function))
		{
			bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, generics, arguments, false);

			if(!bestOverload)
				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);

			function = bestOverload.function;

			type = getType<TypeFunction>(function->type);
		}

		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		if(IsVirtualFunctionCall(ctx, function, bestOverload.context->type))
		{
			ExprBase *table = GetFunctionTable(ctx, source, bestOverload.function);

			value = CreateFunctionCall2(ctx, source, InplaceStr("__redirect"), bestOverload.context, table, false, true, true);

			value = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, value, EXPR_CAST_REINTERPRET);
		}
		else
		{
			value = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, function->type, function, bestOverload.context);
		}

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, true);

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(type)
	{
		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		SmallArray<ArgumentData, 8> functionArguments(ctx.allocator);

		for(TypeHandle *argType = type->arguments.head; argType; argType = argType->next)
			functionArguments.push_back(ArgumentData(NULL, false, NULL, argType->type, NULL));

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		if(!PrepareArgumentsForFunctionCall(ctx, source, functionArguments, arguments, result, NULL, true))
		{
			if(allowFailure)
				return NULL;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				char *errorBuf = ctx.errorBufLocation;
				unsigned errorBufSize = ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf);

				char *errPos = ctx.errorBufLocation;

				if(arguments.size() != functionArguments.size())
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: function expects %d argument(s), while %d are supplied\n", functionArguments.size(), arguments.size());
				else
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: there is no conversion from specified arguments and the ones that function accepts\n");

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tExpected: (");

				for(unsigned i = 0; i < functionArguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(functionArguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")\n");
			
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tProvided: (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && !arguments[0].name)
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Function-style type casts
		return CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);
	}
	else
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Call operator()
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("()"), false))
		{
			SmallArray<ArgumentData, 32> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(value->source, false, NULL, value->type, value));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, callArguments, false))
				return result;
		}
		else
		{
			Report(ctx, source, "ERROR: operator '()' accepting %d argument(s) is undefined for a class '%.*s'", arguments.size(), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}
	}

	assert(type);

	if(type->isGeneric)
		Stop(ctx, source, "ERROR: generic function call is not supported");

	assert(actualArguments.size() == type->arguments.size());

	{
		ExprBase *actual = actualArguments.head;
		TypeHandle *expected = type->arguments.head;

		for(; actual && expected; actual = actual->next, expected = expected->next)
			assert(actual->type == expected->type);

		assert(actual == NULL);
		assert(expected == NULL);
	}

	return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, type->returnType, value, actualArguments);
}